

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O2

interval_t
duckdb::DateTruncBinaryOperator::Operation<duckdb::string_t,duckdb::interval_t,duckdb::interval_t>
          (string_t specifier,interval_t date)

{
  DatePartSpecifier DVar1;
  NotImplementedException *this;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  interval_t iVar6;
  allocator local_71;
  string local_70;
  string local_50;
  string_t specifier_local;
  
  lVar5 = date.micros;
  uVar4 = date._0_8_;
  specifier_local.value.pointer.ptr = (char *)specifier.value._8_8_;
  specifier_local.value._0_8_ = specifier.value._0_8_;
  string_t::GetString_abi_cxx11_(&local_70,&specifier_local);
  DVar1 = GetDatePartSpecifier(&local_70);
  switch(DVar1) {
  case BEGIN_BIGINT:
  case ISOYEAR:
    iVar2 = 0xc;
    break;
  case MONTH:
    uVar4 = uVar4 & 0xffffffff;
  case DAY:
  case DOW:
  case ISODOW:
  case DOY:
  case JULIAN_DAY:
    goto switchD_00ca1deb_caseD_2;
  case DECADE:
    iVar2 = 0x78;
    break;
  case CENTURY:
    iVar2 = 0x4b0;
    break;
  case MILLENNIUM:
    iVar2 = 12000;
    break;
  case MICROSECONDS:
    goto switchD_00ca1deb_caseD_6;
  case MILLISECONDS:
    lVar3 = 1000;
    goto LAB_00ca1e4c;
  case SECOND:
  case BEGIN_DOUBLE:
    lVar3 = 1000000;
    goto LAB_00ca1e4c;
  case MINUTE:
    lVar3 = 60000000;
    goto LAB_00ca1e4c;
  case HOUR:
    lVar3 = 3600000000;
LAB_00ca1e4c:
    lVar5 = lVar5 - lVar5 % lVar3;
    goto switchD_00ca1deb_caseD_6;
  case WEEK:
  case YEARWEEK:
    uVar4 = uVar4 & 0xffffffff |
            (ulong)(uint)(date.days -
                         (int)((long)((ulong)(uint)(date.days >> 0x1f) << 0x20 | uVar4 >> 0x20) % 7)
                         ) << 0x20;
    goto switchD_00ca1deb_caseD_2;
  case QUARTER:
    iVar2 = 3;
    break;
  default:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_50,"Specifier type not implemented for DATETRUNC",&local_71);
    NotImplementedException::NotImplementedException(this,&local_50);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar4 = (ulong)(uint)(date.months -
                       (int)((long)((ulong)(uint)(date.months >> 0x1f) << 0x20 | uVar4 & 0xffffffff)
                            % (long)iVar2));
switchD_00ca1deb_caseD_2:
  lVar5 = 0;
switchD_00ca1deb_caseD_6:
  ::std::__cxx11::string::~string((string *)&local_70);
  iVar6.micros = lVar5;
  iVar6.months = (int)uVar4;
  iVar6.days = (int)(uVar4 >> 0x20);
  return iVar6;
}

Assistant:

static inline TR Operation(TA specifier, TB date) {
		return TruncateElement<TB, TR>(GetDatePartSpecifier(specifier.GetString()), date);
	}